

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O1

void Bac_ManPrepareGates(Bac_Man_t *p)

{
  int iVar1;
  void **ppvVar2;
  char *pcVar3;
  Mio_Gate_t *pGate;
  Dec_Graph_t *pDVar4;
  long lVar5;
  
  if (p->pMioLib != (void *)0x0) {
    iVar1 = Abc_NamObjNumMax(p->pMods);
    ppvVar2 = (void **)calloc((long)iVar1,8);
    iVar1 = Abc_NamObjNumMax(p->pMods);
    if (1 < iVar1) {
      lVar5 = 1;
      do {
        pcVar3 = Abc_NamStr(p->pMods,(int)lVar5);
        pGate = Mio_LibraryReadGateByName((Mio_Library_t *)p->pMioLib,pcVar3,(char *)0x0);
        if (pGate != (Mio_Gate_t *)0x0) {
          pcVar3 = Mio_GateReadSop(pGate);
          pDVar4 = Dec_Factor(pcVar3);
          ppvVar2[lVar5] = pDVar4;
        }
        lVar5 = lVar5 + 1;
        iVar1 = Abc_NamObjNumMax(p->pMods);
      } while (lVar5 < iVar1);
    }
    if (p->ppGraphs != (void **)0x0) {
      __assert_fail("p->ppGraphs == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                    ,0x3d,"void Bac_ManPrepareGates(Bac_Man_t *)");
    }
    p->ppGraphs = ppvVar2;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Bac_ManPrepareGates( Bac_Man_t * p )
{
    Dec_Graph_t ** ppGraphs; int i;
    if ( p->pMioLib == NULL )
        return;
    ppGraphs = ABC_CALLOC( Dec_Graph_t *, Abc_NamObjNumMax(p->pMods) );
    for ( i = 1; i < Abc_NamObjNumMax(p->pMods); i++ )
    {
        char * pGateName = Abc_NamStr( p->pMods, i );
        Mio_Gate_t * pGate = Mio_LibraryReadGateByName( (Mio_Library_t *)p->pMioLib, pGateName, NULL );
        if ( pGate != NULL )
            ppGraphs[i] = Dec_Factor( Mio_GateReadSop(pGate) );
    }
    assert( p->ppGraphs == NULL );
    p->ppGraphs = (void **)ppGraphs;
}